

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O3

void __thiscall llama_context::synchronize(llama_context *this)

{
  long lVar1;
  
  ggml_backend_sched_synchronize
            ((this->sched)._M_t.
             super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>._M_t.
             super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
             super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl);
  lVar1 = this->n_queued_tokens;
  if (lVar1 == 1) {
    lVar1 = 1;
    if ((this->cparams).no_perf == false) {
      lVar1 = ggml_time_us();
      this->t_eval_us = this->t_eval_us + (lVar1 - this->t_compute_start_us);
      lVar1 = this->n_queued_tokens;
    }
    this->n_eval = this->n_eval + 1;
  }
  else {
    if (lVar1 < 2) goto LAB_0018e3ac;
    if ((this->cparams).no_perf == false) {
      lVar1 = ggml_time_us();
      this->t_p_eval_us = this->t_p_eval_us + (lVar1 - this->t_compute_start_us);
      lVar1 = this->n_queued_tokens;
    }
    this->n_p_eval = this->n_p_eval + (int)lVar1;
  }
  if ((0 < lVar1) && (this->has_evaluated_once == false)) {
    lVar1 = ggml_time_us();
    this->t_load_us = lVar1 - this->t_start_us;
    this->has_evaluated_once = true;
  }
LAB_0018e3ac:
  this->t_compute_start_us = 0;
  this->n_queued_tokens = 0;
  return;
}

Assistant:

void llama_context::synchronize() {
    ggml_backend_sched_synchronize(sched.get());

    // FIXME: if multiple single tokens are evaluated without a synchronization,
    // the stats will be added to the prompt evaluation stats
    // this should only happen when using batch size 1 to evaluate a batch

    // add the evaluation to the stats
    if (n_queued_tokens == 1) {
        if (!cparams.no_perf) {
            t_eval_us += ggml_time_us() - t_compute_start_us;
        }
        n_eval++;
    } else if (n_queued_tokens > 1) {
        if (!cparams.no_perf) {
            t_p_eval_us += ggml_time_us() - t_compute_start_us;
        }
        n_p_eval += n_queued_tokens;
    }

    // get a more accurate load time, upon first eval
    if (n_queued_tokens > 0 && !has_evaluated_once) {
        t_load_us = ggml_time_us() - t_start_us;
        has_evaluated_once = true;
    }

    n_queued_tokens = 0;
    t_compute_start_us = 0;
}